

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O1

int fits_rdecomp_byte(uchar *c,int clen,uchar *array,int nx,int nblock)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  char *err_message;
  long lVar11;
  int iVar12;
  int iVar13;
  uint __c;
  byte *pbVar14;
  uint uVar15;
  
  __c = (uint)*c;
  uVar10 = (uint)c[1];
  pbVar14 = c + 2;
  uVar9 = 0;
  iVar13 = 8;
  do {
    uVar7 = (uint)uVar9;
    if (nx <= (int)uVar7) {
      iVar13 = 0;
      if (c + clen <= pbVar14) {
        return 0;
      }
      err_message = "decompression warning: unused bytes at end of compressed buffer";
      goto LAB_001bdee5;
    }
    if (iVar13 < 3) {
      iVar12 = iVar13 + -0xb;
      do {
        iVar13 = iVar12;
        bVar5 = *pbVar14;
        pbVar14 = pbVar14 + 1;
        uVar10 = (uint)bVar5 | uVar10 << 8;
        iVar12 = iVar13 + 8;
      } while (iVar12 < -8);
      iVar13 = iVar13 + 0x10;
    }
    else {
      iVar13 = iVar13 + -3;
    }
    bVar5 = (byte)iVar13;
    uVar3 = uVar10 >> (bVar5 & 0x1f);
    uVar15 = ~(-1 << (bVar5 & 0x1f));
    uVar10 = uVar10 & uVar15;
    iVar12 = uVar7 + nblock;
    if (nx <= (int)(uVar7 + nblock)) {
      iVar12 = nx;
    }
    iVar4 = uVar3 - 1;
    if (iVar4 < 0) {
      if ((int)uVar7 < iVar12) {
        memset(array + (int)uVar7,__c,(ulong)(~uVar7 + iVar12) + 1);
        lVar11 = 0;
        do {
          lVar11 = lVar11 + -1;
        } while ((long)(int)uVar7 - (long)iVar12 != lVar11);
        iVar12 = -(int)lVar11;
LAB_001bde1c:
        uVar9 = (ulong)(uVar7 + iVar12);
      }
    }
    else if (iVar4 == 6) {
      if ((int)uVar7 < iVar12) {
        lVar11 = 0;
        do {
          uVar3 = uVar10 << (8 - bVar5 & 0x1f);
          bVar6 = bVar5;
          if (iVar13 < 1) {
            bVar6 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            uVar3 = uVar3 | bVar6;
            bVar6 = 8;
          }
          if (iVar13 == 0) {
            uVar10 = 0;
          }
          else {
            bVar1 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            uVar3 = uVar3 | bVar1 >> (bVar6 & 0x1f);
            uVar10 = bVar1 & uVar15;
          }
          __c = __c + (-(uVar3 & 1) ^ uVar3 >> 1);
          array[lVar11 + (int)uVar7] = (uchar)__c;
          lVar11 = lVar11 + 1;
        } while ((long)iVar12 - (long)(int)uVar7 != lVar11);
        iVar12 = (int)lVar11;
        goto LAB_001bde1c;
      }
    }
    else if ((int)uVar7 < iVar12) {
      uVar9 = (ulong)(int)uVar7;
      do {
        while (uVar10 == 0) {
          iVar13 = iVar13 + 8;
          bVar5 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          uVar10 = (uint)bVar5;
        }
        uVar3 = iVar13 - nonzero_count[uVar10];
        uVar7 = ~uVar3 + iVar13;
        uVar10 = uVar10 ^ 1 << (uVar7 & 0x1f);
        iVar13 = uVar7 - iVar4;
        iVar8 = iVar13;
        if (iVar13 < 0) {
          do {
            bVar5 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            uVar10 = uVar10 << 8 | (uint)bVar5;
            iVar13 = iVar8 + 8;
            bVar2 = iVar8 < -8;
            iVar8 = iVar13;
          } while (bVar2);
        }
        uVar7 = uVar10 >> ((byte)iVar13 & 0x1f) | uVar3 << ((byte)iVar4 & 0x1f);
        uVar10 = ~(-1 << ((byte)iVar13 & 0x1f)) & uVar10;
        __c = __c + (-(uVar7 & 1) ^ uVar7 >> 1);
        array[uVar9] = (uchar)__c;
        uVar9 = uVar9 + 1;
      } while (uVar9 != (long)iVar12);
    }
  } while (pbVar14 <= c + clen);
  iVar13 = 1;
  err_message = "decompression error: hit end of compressed byte stream";
LAB_001bdee5:
  ffpmsg(err_message);
  return iVar13;
}

Assistant:

int fits_rdecomp_byte (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned char array[],  	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
int i, imax;
/* int bsize; */
int k;
int nbits, nzero, fs;
unsigned char *cend;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */

/*    bsize = 1; */
    
/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 3;
    fsmax = 6;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first byte of input buffer contain the value of the first */
    /* byte integer value, without any encoding */
    
    lastpix = c[0];
    c += 1;  
    cend = c + clen - 1;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
   
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}